

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::internal::UnitTestImpl::~UnitTestImpl(UnitTestImpl *this)

{
  long *plVar1;
  TestResult *in_RDI;
  ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>
  *unaff_retaddr;
  TestResult *functor;
  
  (in_RDI->test_properties_mutex_).super_MutexBase.mutex_.__align =
       (long)&PTR__UnitTestImpl_00219b88;
  functor = in_RDI;
  ForEach<std::vector<testing::TestSuite*,std::allocator<testing::TestSuite*>>,void(*)(testing::TestSuite*)>
            ((vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *)unaff_retaddr,
             (_func_void_TestSuite_ptr *)in_RDI);
  ForEach<std::vector<testing::Environment*,std::allocator<testing::Environment*>>,void(*)(testing::Environment*)>
            ((vector<testing::Environment_*,_std::allocator<testing::Environment_*>_> *)
             unaff_retaddr,(_func_void_Environment_ptr *)functor);
  plVar1 = *(long **)((long)&in_RDI[4].test_properties_mutex_.super_MutexBase.mutex_ + 0x10);
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 8))();
  }
  ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>
  ::~ThreadLocal(unaff_retaddr);
  std::
  unique_ptr<testing::internal::DeathTestFactory,_std::default_delete<testing::internal::DeathTestFactory>_>
  ::~unique_ptr((unique_ptr<testing::internal::DeathTestFactory,_std::default_delete<testing::internal::DeathTestFactory>_>
                 *)in_RDI);
  std::
  unique_ptr<testing::internal::InternalRunDeathTestFlag,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
  ::~unique_ptr((unique_ptr<testing::internal::InternalRunDeathTestFlag,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
                 *)in_RDI);
  TestEventListeners::~TestEventListeners((TestEventListeners *)in_RDI);
  TestResult::~TestResult(in_RDI);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x180232);
  TypeParameterizedTestSuiteRegistry::~TypeParameterizedTestSuiteRegistry
            ((TypeParameterizedTestSuiteRegistry *)0x180243);
  ParameterizedTestSuiteRegistry::~ParameterizedTestSuiteRegistry
            ((ParameterizedTestSuiteRegistry *)this);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr);
  std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::~vector
            ((vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *)unaff_retaddr);
  std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>::~vector
            ((vector<testing::Environment_*,_std::allocator<testing::Environment_*>_> *)
             unaff_retaddr);
  ThreadLocal<testing::TestPartResultReporterInterface_*>::~ThreadLocal
            ((ThreadLocal<testing::TestPartResultReporterInterface_*> *)unaff_retaddr);
  Mutex::~Mutex((Mutex *)unaff_retaddr);
  DefaultPerThreadTestPartResultReporter::~DefaultPerThreadTestPartResultReporter
            ((DefaultPerThreadTestPartResultReporter *)0x1802b4);
  DefaultGlobalTestPartResultReporter::~DefaultGlobalTestPartResultReporter
            ((DefaultGlobalTestPartResultReporter *)0x1802c2);
  FilePath::~FilePath((FilePath *)0x1802d0);
  return;
}

Assistant:

UnitTestImpl::~UnitTestImpl() {
  // Deletes every TestSuite.
  ForEach(test_suites_, internal::Delete<TestSuite>);

  // Deletes every Environment.
  ForEach(environments_, internal::Delete<Environment>);

  delete os_stack_trace_getter_;
}